

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveShapeFunction.h
# Opt level: O3

void __thiscall
anurbs::NurbsCurveShapeFunction::compute_at_span
          (NurbsCurveShapeFunction *this,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *knots,
          Index span,
          Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *weights,
          double t)

{
  double dVar1;
  double dVar2;
  long lVar3;
  bool bVar4;
  double *__ptr;
  long lVar5;
  double *pdVar6;
  long lVar7;
  Index IVar8;
  undefined8 *puVar9;
  ulong uVar10;
  long pole;
  ulong order;
  long k;
  long lVar11;
  long local_78;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_58;
  
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (knots->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            .m_data;
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value =
       (knots->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
       ).
       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
       .m_rows.m_value;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  compute_at_span(this,&local_58,span,t);
  free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  lVar3 = this->m_order;
  if (lVar3 < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/PlainObjectBase.h"
                  ,0x138,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar10 = lVar3 + 1;
  if (uVar10 == 0) {
    __ptr = (double *)0x0;
LAB_001ab6a0:
    free(__ptr);
    return;
  }
  if (uVar10 >> 0x3d == 0) {
    __ptr = (double *)malloc(uVar10 * 8);
    if ((lVar3 != 0) && (((ulong)__ptr & 0xf) != 0)) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade alignd memory allocator.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/util/Memory.h"
                    ,0xa1,"void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (__ptr != (double *)0x0) {
      lVar7 = lVar3;
      order = 0;
      do {
        if (order == uVar10) goto LAB_001ab6d6;
        __ptr[order] = 0.0;
        if (-1 < this->m_degree) {
          lVar7 = 0;
          do {
            lVar5 = this->m_first_nonzero_pole + lVar7;
            if ((lVar5 < 0) ||
               ((weights->
                super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                ).
                super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                .m_rows.m_value <= lVar5)) {
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0xb4,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, 0>::operator()(Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
                           );
            }
            dVar1 = (weights->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).
                    super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                    .m_data[lVar5];
            pdVar6 = value(this,order,lVar7);
            *pdVar6 = dVar1 * *pdVar6;
            pdVar6 = value(this,order,lVar7);
            __ptr[order] = *pdVar6 + __ptr[order];
            bVar4 = lVar7 < this->m_degree;
            lVar7 = lVar7 + 1;
          } while (bVar4);
          lVar7 = this->m_order;
        }
        bVar4 = (long)order < lVar7;
        order = order + 1;
      } while (bVar4);
      if (-1 < lVar7) {
        lVar7 = 0;
        if (0 < lVar3) {
          lVar7 = lVar3;
        }
        local_78 = 1;
        lVar5 = 0;
        do {
          if (lVar5 == 0) {
            lVar11 = this->m_degree;
          }
          else {
            k = 1;
            do {
              IVar8 = Math::binom(lVar5,k);
              if (k == lVar7 + 1) goto LAB_001ab6d6;
              lVar11 = this->m_degree;
              if (-1 < lVar11) {
                dVar1 = __ptr[k];
                pole = -1;
                do {
                  pole = pole + 1;
                  pdVar6 = value(this,lVar5 - k,pole);
                  dVar2 = *pdVar6;
                  pdVar6 = value(this,lVar5,pole);
                  *pdVar6 = dVar2 * -dVar1 * (double)IVar8 + *pdVar6;
                  lVar11 = this->m_degree;
                } while (pole < lVar11);
              }
              k = k + 1;
            } while (k != local_78);
          }
          if (-1 < lVar11) {
            if (lVar3 < 0) {
LAB_001ab6d6:
              __assert_fail("index >= 0 && index < size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                            ,0x198,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                           );
            }
            lVar11 = -1;
            do {
              lVar11 = lVar11 + 1;
              dVar1 = *__ptr;
              pdVar6 = value(this,lVar5,lVar11);
              *pdVar6 = *pdVar6 / dVar1;
            } while (lVar11 < this->m_degree);
          }
          local_78 = local_78 + 1;
          bVar4 = lVar5 < this->m_order;
          lVar5 = lVar5 + 1;
        } while (bVar4);
      }
      goto LAB_001ab6a0;
    }
  }
  puVar9 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar9 = acos;
  __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void compute_at_span(Eigen::Ref<const Eigen::VectorXd> knots, const Index span, Eigen::Ref<const Eigen::VectorXd> weights, const double t)
    {
        using Math::binom;

        // compute B-Spline shape

        compute_at_span(knots, span, t);

        // compute weighted sum

        Eigen::VectorXd weighted_sums(nb_shapes());

        for (Index k = 0; k < nb_shapes(); k++) {
            weighted_sums[k] = 0;

            for (Index i = 0; i < nb_nonzero_poles(); i++) {
                value(k, i) *= weights(m_first_nonzero_pole + i);
                weighted_sums[k] += value(k, i);
            }
        }

        for (Index k = 0; k < nb_shapes(); k++) {
            for (Index i = 1; i <= k; i++) {
                const double a = binom(k, i) * weighted_sums[i];

                for (Index p = 0; p < nb_nonzero_poles(); p++) {
                    value(k, p) -= a * value(k - i, p);
                }
            }

            for (Index p = 0; p < nb_nonzero_poles(); p++) {
                value(k, p) /= weighted_sums[0];
            }
        }
    }